

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O3

pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,int,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_int> *data,int *row,int *column,
          double *value)

{
  int iVar1;
  const_iterator __position;
  int iVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  ostream *poVar4;
  long lVar5;
  int *piVar6;
  bool bVar7;
  int *piVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  value_type_conflict1 *local_38;
  
  iVar1 = *(int *)&(data->row_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_00161628;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_40,(source_location *)row);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                         (int)local_60._M_dataplus._M_p),local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Row index must be positive.",0x1b);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    iVar2 = *row;
    if (-1 < iVar2) {
      lVar5 = *(long *)this;
      piVar8 = (int *)0x0;
      if (*(long *)(this + 8) != lVar5) {
        piVar8 = (int *)(ulong)((int)((ulong)(*(long *)(this + 8) - lVar5) >> 2) - 1);
      }
      if ((int)piVar8 <= iVar1) {
        local_60._M_dataplus._M_p._0_4_ = iVar1 + 1;
        local_40 = (undefined **)CONCAT44(local_40._4_4_,*(undefined4 *)(this + 0x48));
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_40);
        iVar2 = *row;
        lVar5 = *(long *)this;
      }
      local_38 = (value_type_conflict1 *)column;
      if (*(int *)(this + 0x48) <= iVar2) {
        local_60._M_dataplus._M_p._0_4_ = 0;
        if (*(long *)(this + 8) != lVar5) {
          local_60._M_dataplus._M_p._0_4_ = (int)((ulong)(*(long *)(this + 8) - lVar5) >> 2) + -1;
        }
        local_40 = (undefined **)CONCAT44(local_40._4_4_,iVar2 + 1);
        resize<double,int,int>((CSR_Data<double,_int> *)this,(int *)&local_60,(int *)&local_40);
        lVar5 = *(long *)this;
      }
      uVar9 = lVar5 + (long)*(int *)&(data->row_offset).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start * 4;
      lower_bound<double,int,int>((type *)&local_60,this,data,row,piVar8);
      if ((local_60.field_2._M_allocated_capacity == uVar9) &&
         (*(int *)local_60._M_string_length == *row)) {
        _Var3._M_current =
             (double *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p);
        bVar7 = false;
        uVar9 = local_60.field_2._M_allocated_capacity;
      }
      else {
        piVar8 = *(int **)(this + 8);
        piVar6 = (int *)uVar9;
        while (piVar6 = piVar6 + 1, piVar6 < piVar8) {
          *piVar6 = *piVar6 + 1;
        }
        local_60._M_string_length =
             (size_type)
             std::vector<int,_std::allocator<int>_>::insert
                       ((vector<int,_std::allocator<int>_> *)(this + 0x18),
                        (const_iterator)local_60._M_string_length,row);
        __position._M_current._4_4_ = local_60._M_dataplus._M_p._4_4_;
        __position._M_current._0_4_ = (int)local_60._M_dataplus._M_p;
        _Var3._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::insert
                       ((vector<double,_std::allocator<double>_> *)(this + 0x30),__position,local_38
                       );
        bVar7 = true;
      }
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
      ._M_head_impl._M_current = _Var3._M_current;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)local_60._M_string_length;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_head_impl._M_current = (int *)uVar9;
      __return_storage_ptr__->second = bVar7;
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_00161640;
    console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_40,(source_location *)row);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                         (int)local_60._M_dataplus._M_p),local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Columns index must be positive.",0x1f);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&local_60);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}